

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
embree::LBBox<embree::Vec3fa>::LBBox(LBBox<embree::Vec3fa> *this,avector<BBox<Vec3fa>_> *bounds)

{
  BBox<embree::Vec3fa> *pBVar1;
  size_t sVar2;
  BBox<embree::Vec3fa> *pBVar3;
  Vec3fa *pVVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  
  sVar2 = bounds->size_active;
  pBVar3 = bounds->items;
  fVar14 = (pBVar3->lower).field_0.m128[0];
  fVar15 = (pBVar3->lower).field_0.m128[1];
  fVar16 = (pBVar3->lower).field_0.m128[2];
  fVar17 = (pBVar3->lower).field_0.m128[3];
  fVar18 = (pBVar3->upper).field_0.m128[0];
  fVar19 = (pBVar3->upper).field_0.m128[1];
  fVar20 = (pBVar3->upper).field_0.m128[2];
  fVar21 = (pBVar3->upper).field_0.m128[3];
  pBVar1 = pBVar3 + (sVar2 - 1);
  fVar6 = (pBVar1->lower).field_0.m128[0];
  fVar7 = (pBVar1->lower).field_0.m128[1];
  fVar8 = (pBVar1->lower).field_0.m128[2];
  fVar9 = (pBVar1->lower).field_0.m128[3];
  pVVar4 = &pBVar3[sVar2 - 1].upper;
  fVar10 = (pVVar4->field_0).m128[0];
  fVar11 = (pVVar4->field_0).m128[1];
  fVar12 = (pVVar4->field_0).m128[2];
  fVar13 = (pVVar4->field_0).m128[3];
  pVVar4 = &pBVar3[1].upper;
  for (uVar5 = 1; uVar5 < sVar2 - 1; uVar5 = uVar5 + 1) {
    fVar22 = (float)uVar5 / (float)(sVar2 - 1);
    fVar24 = 1.0 - fVar22;
    auVar23._0_4_ =
         (((BBox<embree::Vec3fa> *)(pVVar4 + -1))->lower).field_0.m128[0] -
         (fVar14 * fVar24 + fVar6 * fVar22);
    auVar23._4_4_ =
         (((BBox<embree::Vec3fa> *)(pVVar4 + -1))->lower).field_0.m128[1] -
         (fVar15 * fVar24 + fVar7 * fVar22);
    auVar23._8_4_ =
         (((BBox<embree::Vec3fa> *)(pVVar4 + -1))->lower).field_0.m128[2] -
         (fVar16 * fVar24 + fVar8 * fVar22);
    auVar23._12_4_ =
         (((BBox<embree::Vec3fa> *)(pVVar4 + -1))->lower).field_0.m128[3] -
         (fVar17 * fVar24 + fVar9 * fVar22);
    auVar25._0_4_ = (pVVar4->field_0).m128[0] - (fVar24 * fVar18 + fVar22 * fVar10);
    auVar25._4_4_ = (pVVar4->field_0).m128[1] - (fVar24 * fVar19 + fVar22 * fVar11);
    auVar25._8_4_ = (pVVar4->field_0).m128[2] - (fVar24 * fVar20 + fVar22 * fVar12);
    auVar25._12_4_ = (pVVar4->field_0).m128[3] - (fVar24 * fVar21 + fVar22 * fVar13);
    auVar23 = minps(auVar23,ZEXT816(0));
    auVar25 = maxps(auVar25,ZEXT816(0));
    fVar14 = fVar14 + auVar23._0_4_;
    fVar15 = fVar15 + auVar23._4_4_;
    fVar16 = fVar16 + auVar23._8_4_;
    fVar17 = fVar17 + auVar23._12_4_;
    fVar6 = fVar6 + auVar23._0_4_;
    fVar7 = fVar7 + auVar23._4_4_;
    fVar8 = fVar8 + auVar23._8_4_;
    fVar9 = fVar9 + auVar23._12_4_;
    fVar18 = fVar18 + auVar25._0_4_;
    fVar19 = fVar19 + auVar25._4_4_;
    fVar20 = fVar20 + auVar25._8_4_;
    fVar21 = fVar21 + auVar25._12_4_;
    fVar10 = fVar10 + auVar25._0_4_;
    fVar11 = fVar11 + auVar25._4_4_;
    fVar12 = fVar12 + auVar25._8_4_;
    fVar13 = fVar13 + auVar25._12_4_;
    pVVar4 = pVVar4 + 2;
  }
  (this->bounds0).lower.field_0.m128[0] = fVar14;
  (this->bounds0).lower.field_0.m128[1] = fVar15;
  (this->bounds0).lower.field_0.m128[2] = fVar16;
  (this->bounds0).lower.field_0.m128[3] = fVar17;
  (this->bounds0).upper.field_0.m128[0] = fVar18;
  (this->bounds0).upper.field_0.m128[1] = fVar19;
  (this->bounds0).upper.field_0.m128[2] = fVar20;
  (this->bounds0).upper.field_0.m128[3] = fVar21;
  (this->bounds1).lower.field_0.m128[0] = fVar6;
  (this->bounds1).lower.field_0.m128[1] = fVar7;
  (this->bounds1).lower.field_0.m128[2] = fVar8;
  (this->bounds1).lower.field_0.m128[3] = fVar9;
  (this->bounds1).upper.field_0.m128[0] = fVar10;
  (this->bounds1).upper.field_0.m128[1] = fVar11;
  (this->bounds1).upper.field_0.m128[2] = fVar12;
  (this->bounds1).upper.field_0.m128[3] = fVar13;
  return;
}

Assistant:

__forceinline       T* data()       { return items; }